

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int readDisplacement(InternalInstruction *insn)

{
  int iVar1;
  int32_t local_20;
  short local_1c;
  char local_19;
  int32_t d32;
  int16_t d16;
  int8_t d8;
  InternalInstruction *insn_local;
  
  if ((insn->consumedDisplacement & 1U) == 0) {
    insn->consumedDisplacement = true;
    insn->displacementOffset = (char)(int)insn->readerCursor - (char)(int)insn->startLocation;
    _d32 = insn;
    switch(insn->eaDisplacement) {
    case EA_DISP_NONE:
      insn->consumedDisplacement = false;
      break;
    case EA_DISP_8:
      iVar1 = consumeInt8(insn,&local_19);
      if (iVar1 != 0) {
        return -1;
      }
      _d32->displacement = (int)local_19;
      break;
    case EA_DISP_16:
      iVar1 = consumeInt16(insn,&local_1c);
      if (iVar1 != 0) {
        return -1;
      }
      _d32->displacement = (int)local_1c;
      break;
    case EA_DISP_32:
      iVar1 = consumeInt32(insn,&local_20);
      if (iVar1 != 0) {
        return -1;
      }
      _d32->displacement = local_20;
    }
    _d32->consumedDisplacement = true;
  }
  return 0;
}

Assistant:

static int readDisplacement(struct InternalInstruction *insn)
{
	int8_t d8;
	int16_t d16;
	int32_t d32;

	// dbgprintf(insn, "readDisplacement()");

	if (insn->consumedDisplacement)
		return 0;

	insn->consumedDisplacement = true;
	insn->displacementOffset = (uint8_t)(insn->readerCursor - insn->startLocation);

	switch (insn->eaDisplacement) {
		case EA_DISP_NONE:
			insn->consumedDisplacement = false;
			break;
		case EA_DISP_8:
			if (consumeInt8(insn, &d8))
				return -1;
			insn->displacement = d8;
			break;
		case EA_DISP_16:
			if (consumeInt16(insn, &d16))
				return -1;
			insn->displacement = d16;
			break;
		case EA_DISP_32:
			if (consumeInt32(insn, &d32))
				return -1;
			insn->displacement = d32;
			break;
	}

	insn->consumedDisplacement = true;
	return 0;
}